

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanRedux.h
# Opt level: O2

bool __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>
::all(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>
      *this)

{
  bool bVar1;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>
  eStack_18;
  
  eStack_18.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_bool,_bool>
  .m_d.lhsImpl.super_evaluator<Eigen::Array<bool,_3,_1,_0,_3,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>.m_d.data =
       *(evaluator<Eigen::Array<bool,_3,_1,_0,_3,_1>_> *)this;
  eStack_18.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_bool,_bool>
  .m_d.rhsImpl.super_evaluator<Eigen::Array<bool,_3,_1,_0,_3,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>.m_d.data =
       *(evaluator<Eigen::Array<bool,_3,_1,_0,_3,_1>_> *)(this + 8);
  bVar1 = internal::
          all_unroller<Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<bool,_bool,_(Eigen::internal::ComparisonName)0>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>,_const_Eigen::Array<bool,_3,_1,_0,_3,_1>_>_>,_3,_3>
          ::run(&eStack_18);
  return bVar1;
}

Assistant:

EIGEN_DEVICE_FUNC inline bool DenseBase<Derived>::all() const
{
  typedef internal::evaluator<Derived> Evaluator;
  enum {
    unroll = SizeAtCompileTime != Dynamic
          && SizeAtCompileTime * (int(Evaluator::CoeffReadCost) + int(NumTraits<Scalar>::AddCost)) <= EIGEN_UNROLLING_LIMIT
  };
  Evaluator evaluator(derived());
  if(unroll)
    return internal::all_unroller<Evaluator, unroll ? int(SizeAtCompileTime) : Dynamic, internal::traits<Derived>::RowsAtCompileTime>::run(evaluator);
  else
  {
    for(Index j = 0; j < cols(); ++j)
      for(Index i = 0; i < rows(); ++i)
        if (!evaluator.coeff(i, j)) return false;
    return true;
  }
}